

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

TCGv_i32 rotate_x(TCGContext_conflict2 *tcg_ctx,TCGv_i32 reg,TCGv_i32 shift,int left,int size)

{
  TCGv_i32 pTVar1;
  TCGTemp *pTVar2;
  TCGTemp *a1;
  TCGTemp *a1_00;
  TCGv_i32 c2;
  TCGv_i32 ret;
  uintptr_t o_3;
  TCGv_i32 ret_00;
  uintptr_t o_5;
  TCGv_i32 ret_01;
  uintptr_t o;
  
  pTVar1 = tcg_const_i32_m68k(tcg_ctx,size);
  pTVar2 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
  ret_01 = (TCGv_i32)((long)pTVar2 - (long)tcg_ctx);
  a1 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)a1 - (long)tcg_ctx);
  a1_00 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)a1_00 - (long)tcg_ctx);
  if (left == 0) {
    if (ret_01 != shift) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)pTVar2,
                       (TCGArg)(shift + (long)&tcg_ctx->pool_cur));
    }
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)a1,(long)(size + 1));
    tcg_gen_sub_i32(tcg_ctx,ret,ret,shift);
    tcg_gen_sub_i32(tcg_ctx,ret_00,pTVar1,shift);
  }
  else {
    if (ret != shift) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)a1,
                       (TCGArg)(shift + (long)&tcg_ctx->pool_cur));
    }
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)pTVar2,(long)(size + 1));
    tcg_gen_sub_i32(tcg_ctx,ret_01,ret_01,shift);
    tcg_gen_subi_i32_m68k(tcg_ctx,ret_00,shift,1);
    c2 = tcg_const_i32_m68k(tcg_ctx,0);
    tcg_gen_movcond_i32_m68k(tcg_ctx,TCG_COND_LT,ret_00,ret_00,c2,pTVar1,ret_00);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(c2 + (long)tcg_ctx));
  }
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  pTVar1 = reg + (long)&tcg_ctx->pool_cur;
  tcg_gen_op3_m68k(tcg_ctx,INDEX_op_shl_i32,(TCGArg)a1,(TCGArg)pTVar1,(TCGArg)a1);
  tcg_gen_op3_m68k(tcg_ctx,INDEX_op_shr_i32,(TCGArg)pTVar2,(TCGArg)pTVar1,(TCGArg)pTVar2);
  tcg_gen_op3_m68k(tcg_ctx,INDEX_op_or_i32,(TCGArg)pTVar1,(TCGArg)a1,(TCGArg)pTVar2);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  tcg_gen_op3_m68k(tcg_ctx,INDEX_op_shl_i32,(TCGArg)a1_00,(TCGArg)(QREG_CC_X + (long)tcg_ctx),
                   (TCGArg)a1_00);
  tcg_gen_op3_m68k(tcg_ctx,INDEX_op_or_i32,(TCGArg)pTVar1,(TCGArg)pTVar1,(TCGArg)a1_00);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  pTVar2 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
  tcg_gen_extract_i32_m68k(tcg_ctx,(TCGv_i32)((long)pTVar2 - (long)tcg_ctx),reg,size,1);
  return (TCGv_i32)((long)pTVar2 - (long)tcg_ctx);
}

Assistant:

static TCGv rotate_x(TCGContext *tcg_ctx, TCGv reg, TCGv shift, int left, int size)
{
    TCGv X, shl, shr, shx, sz, zero;

    sz = tcg_const_i32(tcg_ctx, size);

    shr = tcg_temp_new(tcg_ctx);
    shl = tcg_temp_new(tcg_ctx);
    shx = tcg_temp_new(tcg_ctx);
    if (left) {
        tcg_gen_mov_i32(tcg_ctx, shl, shift);      /* shl = shift */
        tcg_gen_movi_i32(tcg_ctx, shr, size + 1);
        tcg_gen_sub_i32(tcg_ctx, shr, shr, shift); /* shr = size + 1 - shift */
        tcg_gen_subi_i32(tcg_ctx, shx, shift, 1);  /* shx = shift - 1 */
        /* shx = shx < 0 ? size : shx; */
        zero = tcg_const_i32(tcg_ctx, 0);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LT, shx, shx, zero, sz, shx);
        tcg_temp_free(tcg_ctx, zero);
    } else {
        tcg_gen_mov_i32(tcg_ctx, shr, shift);      /* shr = shift */
        tcg_gen_movi_i32(tcg_ctx, shl, size + 1);
        tcg_gen_sub_i32(tcg_ctx, shl, shl, shift); /* shl = size + 1 - shift */
        tcg_gen_sub_i32(tcg_ctx, shx, sz, shift); /* shx = size - shift */
    }
    tcg_temp_free_i32(tcg_ctx, sz);

    /* reg = (reg << shl) | (reg >> shr) | (x << shx); */

    tcg_gen_shl_i32(tcg_ctx, shl, reg, shl);
    tcg_gen_shr_i32(tcg_ctx, shr, reg, shr);
    tcg_gen_or_i32(tcg_ctx, reg, shl, shr);
    tcg_temp_free(tcg_ctx, shl);
    tcg_temp_free(tcg_ctx, shr);
    tcg_gen_shl_i32(tcg_ctx, shx, QREG_CC_X, shx);
    tcg_gen_or_i32(tcg_ctx, reg, reg, shx);
    tcg_temp_free(tcg_ctx, shx);

    /* X = (reg >> size) & 1 */

    X = tcg_temp_new(tcg_ctx);
    tcg_gen_extract_i32(tcg_ctx, X, reg, size, 1);

    return X;
}